

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint lodepng::load_file(vector<unsigned_char,_std::allocator<unsigned_char>_> *buffer,
                       string *filename)

{
  uint uVar1;
  size_type __new_size;
  
  __new_size = lodepng_filesize((filename->_M_dataplus)._M_p);
  if ((long)__new_size < 0) {
    uVar1 = 0x4e;
  }
  else {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(buffer,__new_size);
    if (__new_size != 0) {
      uVar1 = lodepng_buffer_file((buffer->
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                                  ._M_impl.super__Vector_impl_data._M_start,__new_size,
                                  (filename->_M_dataplus)._M_p);
      return uVar1;
    }
    uVar1 = 0;
  }
  return uVar1;
}

Assistant:

unsigned load_file(std::vector<unsigned char>& buffer, const std::string& filename) {
  long size = lodepng_filesize(filename.c_str());
  if(size < 0) return 78;
  buffer.resize((size_t)size);
  return size == 0 ? 0 : lodepng_buffer_file(&buffer[0], (size_t)size, filename.c_str());
}